

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall aiString::Append(aiString *this,char *app)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = strlen(app);
  iVar2 = (int)sVar1;
  if ((iVar2 != 0) && (this->length + iVar2 < 0x400)) {
    memcpy(this->data + this->length,app,(ulong)(iVar2 + 1));
    this->length = this->length + iVar2;
  }
  return;
}

Assistant:

void Append (const char* app)   {
        const ai_uint32 len = (ai_uint32) ::strlen(app);
        if (!len) {
            return;
        }
        if (length + len >= MAXLEN) {
            return;
        }

        memcpy(&data[length],app,len+1);
        length += len;
    }